

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  int *piVar1;
  int *piVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  int *piVar5;
  uint uVar6;
  ImGuiContext *ctx;
  uint uVar7;
  
  pIVar3 = GImGui;
  uVar4 = (GImGui->ItemFlagsStack).Size;
  if ((long)(int)uVar4 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                  ,0x70c,"T &ImVector<int>::back() [T = int]");
  }
  uVar7 = GImGui->CurrentItemFlags;
  piVar5 = (GImGui->ItemFlagsStack).Data;
  if (uVar7 == piVar5[(long)(int)uVar4 + -1]) {
    uVar6 = uVar7 | option;
    if (!enabled) {
      uVar6 = ~option & uVar7;
    }
    GImGui->CurrentItemFlags = uVar6;
    if (uVar4 == (pIVar3->ItemFlagsStack).Capacity) {
      uVar7 = (uVar4 >> 1) + uVar4;
      if (uVar7 <= uVar4 + 1) {
        uVar7 = uVar4 + 1;
      }
      piVar5 = &(pIVar3->IO).MetricsActiveAllocations;
      *piVar5 = *piVar5 + 1;
      piVar5 = (int *)(*GImAllocatorAllocFunc)((ulong)uVar7 * 4,GImAllocatorUserData);
      piVar2 = (pIVar3->ItemFlagsStack).Data;
      if (piVar2 != (int *)0x0) {
        memcpy(piVar5,piVar2,(long)(pIVar3->ItemFlagsStack).Size << 2);
        piVar2 = (pIVar3->ItemFlagsStack).Data;
        if ((piVar2 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(piVar2,GImAllocatorUserData);
      }
      (pIVar3->ItemFlagsStack).Data = piVar5;
      (pIVar3->ItemFlagsStack).Capacity = uVar7;
      uVar4 = (pIVar3->ItemFlagsStack).Size;
    }
    piVar5[(int)uVar4] = uVar6;
    (pIVar3->ItemFlagsStack).Size = (pIVar3->ItemFlagsStack).Size + 1;
    return;
  }
  __assert_fail("item_flags == g.ItemFlagsStack.back()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                ,0x1afb,"void ImGui::PushItemFlag(ImGuiItemFlags, bool)");
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiItemFlags item_flags = g.CurrentItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    g.CurrentItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}